

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O3

void Abc_NtkCountInst(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    uVar3 = pNtk->nObjCounts[7];
  }
  else {
    pVVar1 = pNtk->pDesign->vModules;
    lVar4 = (long)pVVar1->nSize;
    if (0 < lVar4) {
      ppvVar2 = pVVar1->pArray;
      lVar5 = 0;
      do {
        *(undefined4 *)((long)ppvVar2[lVar5] + 0xa8) = 0xffffffff;
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    uVar3 = Abc_NtkCountInst_rec(pNtk);
  }
  printf("Instances = %10d.\n",(ulong)uVar3);
  return;
}

Assistant:

void Abc_NtkCountInst( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Abc_Ntk_t * pModel;
    int i, Counter;

    if ( pNtk->pDesign == NULL )
        Counter = Abc_NtkNodeNum(pNtk);
    else
    {
        vMods = pNtk->pDesign->vModules;
        Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
            pModel->iStep = -1;
        Counter = Abc_NtkCountInst_rec( pNtk );
    }
    printf( "Instances = %10d.\n", Counter );
}